

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

int req0_pipe_start(void *arg)

{
  req0_sock *s;
  uint16_t uVar1;
  int iVar2;
  
  s = *(req0_sock **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x31) {
    nni_mtx_lock(&s->mtx);
    nni_list_append(&s->ready_pipes,arg);
    nni_pollable_raise(&s->writable);
    iVar2 = 0;
    req0_run_send_queue(s,(nni_aio_completions *)0x0);
    nni_mtx_unlock(&s->mtx);
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x208));
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x31
                );
    iVar2 = 0xd;
  }
  return iVar2;
}

Assistant:

static int
req0_pipe_start(void *arg)
{
	req0_pipe *p = arg;
	req0_sock *s = p->req;

	if (nni_pipe_peer(p->pipe) != REQ0_PEER) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), REQ0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	nni_list_append(&s->ready_pipes, p);
	nni_pollable_raise(&s->writable);
	req0_run_send_queue(s, NULL);
	nni_mtx_unlock(&s->mtx);

	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}